

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

int read_delta_qindex(AV1_COMMON *cm,MACROBLOCKD *xd,aom_reader *r,MB_MODE_INFO *mbmi)

{
  int iVar1;
  char *in_RCX;
  uint *in_RSI;
  long in_RDI;
  int thr;
  int rem_bits;
  int smallval;
  FRAME_CONTEXT *ec_ctx;
  int read_delta_q_flag;
  int b_row;
  int b_col;
  BLOCK_SIZE bsize;
  int reduced_delta_qindex;
  int abs;
  int sign;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  bool local_55;
  int local_2c;
  int local_28;
  int local_24;
  
  local_2c = 0;
  local_55 = (in_RSI[1] & *(int *)(*(long *)(in_RDI + 0x6088) + 0x20) - 1U) == 0 &&
             (*in_RSI & *(int *)(*(long *)(in_RDI + 0x6088) + 0x20) - 1U) == 0;
  if (((*in_RCX != *(char *)(*(long *)(in_RDI + 0x6088) + 0x1c)) || (in_RCX[0x90] == '\0')) &&
     (local_55)) {
    local_28 = aom_read_symbol_((aom_reader *)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                (aom_cdf_prob *)
                                CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
    if (2 < local_28) {
      iVar1 = aom_read_literal_((aom_reader *)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                in_stack_ffffffffffffff9c);
      local_28 = aom_read_literal_((aom_reader *)
                                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                   in_stack_ffffffffffffff9c);
      local_28 = local_28 + (1 << ((char)iVar1 + 1U & 0x1f)) + 1;
    }
    if (local_28 == 0) {
      local_24 = 1;
    }
    else {
      local_24 = aom_read_bit_((aom_reader *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    }
    local_2c = local_28;
    if (local_24 != 0) {
      local_2c = -local_28;
    }
  }
  return local_2c;
}

Assistant:

static int read_delta_qindex(AV1_COMMON *cm, const MACROBLOCKD *xd,
                             aom_reader *r, MB_MODE_INFO *const mbmi) {
  int sign, abs, reduced_delta_qindex = 0;
  BLOCK_SIZE bsize = mbmi->bsize;
  const int b_col = xd->mi_col & (cm->seq_params->mib_size - 1);
  const int b_row = xd->mi_row & (cm->seq_params->mib_size - 1);
  const int read_delta_q_flag = (b_col == 0 && b_row == 0);
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;

  if ((bsize != cm->seq_params->sb_size || mbmi->skip_txfm == 0) &&
      read_delta_q_flag) {
    abs = aom_read_symbol(r, ec_ctx->delta_q_cdf, DELTA_Q_PROBS + 1, ACCT_STR);
    const int smallval = (abs < DELTA_Q_SMALL);

    if (!smallval) {
      const int rem_bits = aom_read_literal(r, 3, ACCT_STR) + 1;
      const int thr = (1 << rem_bits) + 1;
      abs = aom_read_literal(r, rem_bits, ACCT_STR) + thr;
    }

    if (abs) {
      sign = aom_read_bit(r, ACCT_STR);
    } else {
      sign = 1;
    }

    reduced_delta_qindex = sign ? -abs : abs;
  }
  return reduced_delta_qindex;
}